

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

ANNcoord annSpread(ANNpointArray pa,ANNidxArray pidx,int n,int d)

{
  double dVar1;
  ANNcoord AVar2;
  ANNcoord c;
  int i;
  ANNcoord max;
  ANNcoord min;
  int d_local;
  int n_local;
  ANNidxArray pidx_local;
  ANNpointArray pa_local;
  
  min = pa[*pidx][d];
  max = pa[*pidx][d];
  for (i = 1; i < n; i = i + 1) {
    dVar1 = pa[pidx[i]][d];
    AVar2 = dVar1;
    if ((min <= dVar1) && (AVar2 = min, max < dVar1)) {
      max = dVar1;
    }
    min = AVar2;
  }
  return max - min;
}

Assistant:

ANNcoord annSpread(    // compute point spread along dimension
    ANNpointArray pa,  // point array
    ANNidxArray pidx,  // point indices
    int n,             // number of points
    int d)             // dimension to check
{
    ANNcoord min = PA(0, d);  // compute max and min coords
    ANNcoord max = PA(0, d);
    for (int i = 1; i < n; i++) {
        ANNcoord c = PA(i, d);
        if (c < min)
            min = c;
        else if (c > max)
            max = c;
    }
    return (max - min);  // total spread is difference
}